

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O1

void lcase(char *cp)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  
  if ((cp != (char *)0x0) && (cVar1 = *cp, cVar1 != '\0')) {
    pcVar3 = cp + 1;
    do {
      cVar2 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar2 = cVar1;
      }
      pcVar3[-1] = cVar2;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void
lcase(register char *cp)
{
    if (cp) {
        while (*cp) {
            *cp = LOWER_CASE(*cp);
            cp++;
        }
    }
}